

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateArenaDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  int iVar1;
  pointer ppFVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  long lVar5;
  byte bVar6;
  char *text;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  value = &this->classname_;
  io::Printer::Print(printer,"void $classname$::ArenaDtor(void* object) {\n","classname",value);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "$classname$* _this = reinterpret_cast< $classname$* >(object);\n(void)_this;\n"
                     ,"classname",value);
  ppFVar2 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppFVar2) {
    bVar6 = 0;
  }
  else {
    uVar7 = 0;
    bVar6 = 0;
    do {
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,ppFVar2[uVar7]);
      iVar1 = (*pFVar3->_vptr_FieldGenerator[0x10])(pFVar3,printer);
      bVar6 = bVar6 | (byte)iVar1;
      uVar7 = uVar7 + 1;
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->optimized_order_).
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3))
    ;
  }
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x38)) {
    lVar8 = 0;
    do {
      if (0 < *(int *)(*(long *)(pDVar4 + 0x40) + 0x1c + lVar8 * 0x30)) {
        lVar5 = *(long *)(pDVar4 + 0x40) + lVar8 * 0x30;
        lVar9 = 0;
        do {
          pFVar3 = FieldGeneratorMap::get
                             (&this->field_generators_,
                              *(FieldDescriptor **)(*(long *)(lVar5 + 0x20) + lVar9 * 8));
          iVar1 = (*pFVar3->_vptr_FieldGenerator[0x10])(pFVar3,printer);
          bVar6 = bVar6 | (byte)iVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)(lVar5 + 0x1c));
        pDVar4 = this->descriptor_;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)(pDVar4 + 0x38));
  }
  if (this->num_weak_fields_ == 0) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    text = "void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n}\n";
    if ((bVar6 & 1) != 0) {
      text = 
      "inline void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n  if (arena != NULL) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
      ;
    }
  }
  else {
    io::Printer::Print(printer,"_this->_weak_field_map_.ClearAll();\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    text = 
    "inline void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n  if (arena != NULL) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
    ;
  }
  io::Printer::Print(printer,text,"classname",value);
  return;
}

Assistant:

void MessageGenerator::
GenerateArenaDestructorCode(io::Printer* printer) {
  // Generate the ArenaDtor() method. Track whether any fields actually produced
  // code that needs to be called.
  printer->Print(
      "void $classname$::ArenaDtor(void* object) {\n",
      "classname", classname_);
  printer->Indent();

  // This code is placed inside a static method, rather than an ordinary one,
  // since that simplifies Arena's destructor list (ordinary function pointers
  // rather than member function pointers). _this is the object being
  // destructed.
  printer->Print(
      "$classname$* _this = reinterpret_cast< $classname$* >(object);\n"
      // avoid an "unused variable" warning in case no fields have dtor code.
      "(void)_this;\n",
      "classname", classname_);

  bool need_registration = false;
  // Process non-oneof fields first.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    if (field_generators_.get(field)
                         .GenerateArenaDestructorCode(printer)) {
      need_registration = true;
    }
  }

  // Process oneof fields.
  //
  // Note:  As of 10/5/2016, GenerateArenaDestructorCode does not emit anything
  // and returns false for oneof fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);

    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      if (field_generators_.get(field)
                           .GenerateArenaDestructorCode(printer)) {
        need_registration = true;
      }
    }
  }
  if (num_weak_fields_) {
    // _this is the object being destructed (we are inside a static method
    // here).
    printer->Print("_this->_weak_field_map_.ClearAll();\n");
    need_registration = true;
  }

  printer->Outdent();
  printer->Print(
      "}\n");

  if (need_registration) {
    printer->Print(
        "inline void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n"
        "  if (arena != NULL) {\n"
        "    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n"
        "  }\n"
        "}\n",
        "classname", classname_);
  } else {
    printer->Print(
        "void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n"
        "}\n",
        "classname", classname_);
  }
}